

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::dht_log_alert::message_abi_cxx11_(string *__return_storage_ptr__,dht_log_alert *this)

{
  char *pcVar1;
  char *pcVar2;
  char ret [900];
  allocator<char> local_3a9;
  char local_3a8 [912];
  
  pcVar1 = message::dht_modules.super_array<const_char_*,_5UL>._M_elems[this->module];
  pcVar2 = log_message(this);
  snprintf(local_3a8,900,"DHT %s: %s",pcVar1,pcVar2);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_3a8,&local_3a9);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_log_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		static aux::array<char const*, 5, dht_module_t> const dht_modules{{
			"tracker",
			"node",
			"routing_table",
			"rpc_manager",
			"traversal"
		}};

		char ret[900];
		std::snprintf(ret, sizeof(ret), "DHT %s: %s", dht_modules[module]
			, log_message());
		return ret;
#endif
	}